

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O1

DHUDMessage * __thiscall DBaseStatusBar::DetachMessage(DBaseStatusBar *this,DWORD id)

{
  DHUDMessage *in_RAX;
  DHUDMessage *pDVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DHUDMessage>_1 *paVar2;
  DHUDMessage *pDVar3;
  long lVar4;
  
  lVar4 = 0;
  do {
    paVar2 = &this->Messages[lVar4].field_0;
    pDVar1 = paVar2->p;
    while( true ) {
      pDVar3 = pDVar1;
      if ((pDVar1 != (DHUDMessage *)0x0) && (((pDVar1->super_DObject).ObjectFlags & 0x20) != 0)) {
        paVar2->p = (DHUDMessage *)0x0;
        pDVar3 = (DHUDMessage *)0x0;
      }
      if (pDVar3 == (DHUDMessage *)0x0) goto LAB_004d06b6;
      if (pDVar3->SBarID == id) break;
      pDVar1 = (pDVar3->Next).field_0.p;
      paVar2 = &(pDVar3->Next).field_0;
    }
    pDVar1 = (pDVar3->Next).field_0.p;
    if ((pDVar1 != (DHUDMessage *)0x0) && (((pDVar1->super_DObject).ObjectFlags & 0x20) != 0)) {
      (pDVar3->Next).field_0.p = (DHUDMessage *)0x0;
      pDVar1 = (DHUDMessage *)0x0;
    }
    paVar2->p = pDVar1;
    (pDVar3->Next).field_0.p = (DHUDMessage *)0x0;
    in_RAX = pDVar3;
    if (screen != (DFrameBuffer *)0x0) {
      if (StatusBar == (DBaseStatusBar *)0x0) {
        SB_state = 0;
      }
      else {
        SB_state = (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0x20])
                             ();
      }
    }
LAB_004d06b6:
    if (pDVar3 != (DHUDMessage *)0x0) {
      return in_RAX;
    }
    lVar4 = lVar4 + 1;
    if (lVar4 == 3) {
      return (DHUDMessage *)0x0;
    }
  } while( true );
}

Assistant:

DHUDMessage *DBaseStatusBar::DetachMessage (DWORD id)
{
	for (size_t i = 0; i < countof(Messages); ++i)
	{
		DHUDMessage *probe = Messages[i];
		DHUDMessage **prev = &Messages[i];

		while (probe && probe->SBarID != id)
		{
			prev = &probe->Next;
			probe = probe->Next;
		}
		if (probe != NULL)
		{
			*prev = probe->Next;
			probe->Next = NULL;
			// Redraw the status bar in case it was covered
			if (screen != NULL)
			{
				ST_SetNeedRefresh();
			}
			return probe;
		}
	}
	return NULL;
}